

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode *
CTcPrsOpUnary::parse_embedded_if(CTcEmbedBuilder *b,int unless,int *eos,CTcEmbedLevel *parent)

{
  bool bVar1;
  tc_toktyp_t tVar2;
  int iVar3;
  CTcPrsNode *pCVar4;
  CTcTokenizer *pCVar5;
  CTcTokenizer *first;
  CTcEmbedLevel *in_RCX;
  int *in_RDX;
  uint in_ESI;
  long *in_RDI;
  bool bVar6;
  CTcPrsNode *sub_1;
  CTPNIf *sub;
  CTcEmbedLevel *in_stack_00000048;
  int found_else;
  CTPNIf *tail;
  CTPNIf *top;
  CTcPrsNode *then;
  CTcPrsNode *cond;
  CTcEmbedLevel level;
  CTcPrsNode *in_stack_ffffffffffffff48;
  CTcParser *in_stack_ffffffffffffff50;
  CTcTokenizer *in_stack_ffffffffffffff58;
  CTcTokenizer *in_stack_ffffffffffffff60;
  CTcTokenizer *local_68;
  CTcEmbedLevel local_38;
  int *local_20;
  uint local_14;
  long *local_10;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  CTcEmbedLevel::CTcEmbedLevel(&local_38,1,in_RCX);
  pCVar4 = CTcParser::parse_cond_expr(in_stack_ffffffffffffff50);
  if (pCVar4 != (CTcPrsNode *)0x0) {
    if (local_14 != 0) {
      CTcPrsAllocObj::operator_new(0x255bf1);
      CTPNNot::CTPNNot((CTPNNot *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    pCVar4 = parse_embedding_list((CTcEmbedBuilder *)top,(int *)tail,in_stack_00000048);
    if (pCVar4 != (CTcPrsNode *)0x0) {
      pCVar5 = (CTcTokenizer *)CTcPrsAllocObj::operator_new(0x255c7b);
      CTPNIf::CTPNIf((CTPNIf *)in_stack_ffffffffffffff60,(CTcPrsNode *)in_stack_ffffffffffffff58,
                     (CTcPrsNode *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      bVar1 = false;
      local_68 = pCVar5;
      while( true ) {
        bVar6 = false;
        if (*local_20 == 0) {
          tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x255cd9);
          bVar6 = true;
          if (tVar2 != TOKT_ELSE) {
            iVar3 = CTcTokenizer::cur_tok_matches
                              (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
            bVar6 = iVar3 != 0;
          }
        }
        if (!bVar6) break;
        tVar2 = CTcTokenizer::next(in_stack_ffffffffffffff58);
        if ((tVar2 != TOKT_IF) &&
           (iVar3 = CTcTokenizer::cur_tok_matches
                              (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58),
           iVar3 == 0)) {
          pCVar4 = parse_embedding_list((CTcEmbedBuilder *)top,(int *)tail,in_stack_00000048);
          if (pCVar4 == (CTcPrsNode *)0x0) {
            return (CTcPrsNode *)0x0;
          }
          CTPNIfBase::set_else((CTPNIfBase *)local_68,pCVar4);
          bVar1 = true;
          break;
        }
        tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x255d5d);
        local_14 = (uint)(tVar2 != TOKT_IF);
        CTcTokenizer::next(in_stack_ffffffffffffff58);
        pCVar4 = CTcParser::parse_cond_expr(in_stack_ffffffffffffff50);
        if (pCVar4 == (CTcPrsNode *)0x0) {
          return (CTcPrsNode *)0x0;
        }
        if (local_14 != 0) {
          in_stack_ffffffffffffff60 = (CTcTokenizer *)CTcPrsAllocObj::operator_new(0x255de1);
          CTPNNot::CTPNNot((CTPNNot *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        }
        pCVar4 = parse_embedding_list((CTcEmbedBuilder *)top,(int *)tail,in_stack_00000048);
        if (pCVar4 == (CTcPrsNode *)0x0) {
          return (CTcPrsNode *)0x0;
        }
        first = (CTcTokenizer *)CTcPrsAllocObj::operator_new(0x255e6b);
        CTPNIf::CTPNIf((CTPNIf *)in_stack_ffffffffffffff60,(CTcPrsNode *)first,
                       (CTcPrsNode *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        in_stack_ffffffffffffff58 = first;
        CTPNIfBase::set_else((CTPNIfBase *)local_68,(CTcPrsNode *)first);
        local_68 = first;
      }
      if (!bVar1) {
        pCVar4 = (CTcPrsNode *)(**(code **)(*local_10 + 0x10))(local_10,0);
        CTPNIfBase::set_else((CTPNIfBase *)local_68,pCVar4);
      }
      if (*local_20 == 0) {
        iVar3 = CTcTokenizer::cur_tok_matches
                          (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
        if (iVar3 != 0) {
          CTcTokenizer::next(in_stack_ffffffffffffff58);
          return (CTcPrsNode *)pCVar5;
        }
        return (CTcPrsNode *)pCVar5;
      }
      return (CTcPrsNode *)pCVar5;
    }
  }
  return (CTcPrsNode *)0x0;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_embedded_if(
    CTcEmbedBuilder *b, int unless, int &eos, CTcEmbedLevel *parent)
{
    /* set up our embedding stack level */
    CTcEmbedLevel level(CTcEmbedLevel::If, parent);

    /* parse the condition expression */
    CTcPrsNode *cond = G_prs->parse_cond_expr();
    if (cond == 0)
        return 0;

    /* if this is an "unless", invert the condition */
    if (unless)
        cond = new CTPNNot(cond);
    
    /* parse the "then" list */
    CTcPrsNode *then = parse_embedding_list(b, eos, &level);
    if (then == 0)
        return 0;

    /* 
     *   create our top-level 'if' node - leave the 'else' branch empty for
     *   now; we'll build this out if we find an 'else' 
     */
    CTPNIf *top = new CTPNIf(cond, then, 0);

    /* 
     *   as we build out the 'else if' branches, we'll add elses to the tail
     *   of the tree; this is currently the top node 
     */
    CTPNIf *tail = top;

    /* parse zero or more "else if" branches */
    int found_else = FALSE;
    while (!eos
           && (G_tok->cur() == TOKT_ELSE
               || G_tok->cur_tok_matches("otherwise")))
    {
        /* skip the "else"/"otherwise", and check for another "if" */
        if (G_tok->next() == TOKT_IF || G_tok->cur_tok_matches("unless"))
        {
            /* 
             *   <<else if cond>> or <<else unless cond>>.  Note which sense
             *   of the test we're using.
             */
            unless = (G_tok->cur() != TOKT_IF);

            /* skip the "else"/"otherwise" and parse the condition */
            G_tok->next();
            cond = G_prs->parse_cond_expr();
            if (cond == 0)
                return 0;

            /* if it's 'unless', invert the condition */
            if (unless)
                cond = new CTPNNot(cond);

            /* parse the "then" list for this new branch */
            then = parse_embedding_list(b, eos, &level);
            if (then == 0)
                return 0;

            /* add the new 'if' node to the 'else' of the tail of the tree */
            CTPNIf *sub = new CTPNIf(cond, then, 0);
            tail->set_else(sub);

            /* this is the new tail, for adding the next 'else' */
            tail = sub;
        }
        else
        {
            /* it's the final else/otherwise - parse the branch */
            CTcPrsNode *sub = parse_embedding_list(b, eos, &level);
            if (sub == 0)
                return 0;

            /* add it as the else branch of the tail node of the tree */
            tail->set_else(sub);

            /* no more clauses of the "if" can follow an "else" */
            found_else = TRUE;
            break;
        }
    }

    /* 
     *   if we ended without an "else", add an implicit "nil" as the final
     *   "else" branch 
     */
    if (!found_else)
        tail->set_else(b->finish_tree(0));

    /* 
     *   If we're at an "end" token, this is the explicit close of the "if".
     *   Otherwise, the "if" ended implicitly at the end of the string or at
     *   a closing token for a containing structure. 
     */
    if (!eos && G_tok->cur_tok_matches("end"))
        G_tok->next();

    /* return the condition tree */
    return top;
}